

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory.h
# Opt level: O0

void Eigen::internal::queryCacheSizes_intel_codes(int *l1,int *l2,int *l3)

{
  bool bVar1;
  int i;
  bool check_for_p2_core2;
  uchar *bytes;
  int abcd [4];
  int *l3_local;
  int *l2_local;
  int *l1_local;
  
  *l3 = 0;
  *l2 = 0;
  *l1 = 0;
  cpuid_cache_tlb_info(2);
  bVar1 = false;
  for (i = 0; i < 0xe; i = i + 1) {
    switch(*(undefined1 *)((long)abcd + (long)i + 2)) {
    case 10:
      *l1 = 8;
      break;
    default:
      break;
    case 0xc:
      *l1 = 0x10;
      break;
    case 0xe:
      *l1 = 0x18;
      break;
    case 0x10:
      *l1 = 0x10;
      break;
    case 0x15:
      *l1 = 0x10;
      break;
    case 0x1a:
      *l2 = 0x60;
      break;
    case 0x22:
      *l3 = 0x200;
      break;
    case 0x23:
      *l3 = 0x400;
      break;
    case 0x25:
      *l3 = 0x800;
      break;
    case 0x29:
      *l3 = 0x1000;
      break;
    case 0x2c:
      *l1 = 0x20;
      break;
    case 0x30:
      *l1 = 0x20;
      break;
    case 0x39:
      *l2 = 0x80;
      break;
    case 0x3a:
      *l2 = 0xc0;
      break;
    case 0x3b:
      *l2 = 0x80;
      break;
    case 0x3c:
      *l2 = 0x100;
      break;
    case 0x3d:
      *l2 = 0x180;
      break;
    case 0x3e:
      *l2 = 0x200;
      break;
    case 0x40:
      *l2 = 0;
      break;
    case 0x41:
      *l2 = 0x80;
      break;
    case 0x42:
      *l2 = 0x100;
      break;
    case 0x43:
      *l2 = 0x200;
      break;
    case 0x44:
      *l2 = 0x400;
      break;
    case 0x45:
      *l2 = 0x800;
      break;
    case 0x46:
      *l3 = 0x1000;
      break;
    case 0x47:
      *l3 = 0x2000;
      break;
    case 0x48:
      *l2 = 0xc00;
      break;
    case 0x49:
      if (*l2 == 0) {
        bVar1 = true;
        *l2 = 0x1000;
        *l3 = 0x1000;
      }
      else {
        *l3 = 0x1000;
      }
      break;
    case 0x4a:
      *l3 = 0x1800;
      break;
    case 0x4b:
      *l3 = 0x2000;
      break;
    case 0x4c:
      *l3 = 0x3000;
      break;
    case 0x4d:
      *l3 = 0x4000;
      break;
    case 0x4e:
      *l2 = 0x1800;
      break;
    case 0x60:
      *l1 = 0x10;
      break;
    case 0x66:
      *l1 = 8;
      break;
    case 0x67:
      *l1 = 0x10;
      break;
    case 0x68:
      *l1 = 0x20;
      break;
    case 0x78:
      *l2 = 0x400;
      break;
    case 0x79:
      *l2 = 0x80;
      break;
    case 0x7a:
      *l2 = 0x100;
      break;
    case 0x7b:
      *l2 = 0x200;
      break;
    case 0x7c:
      *l2 = 0x400;
      break;
    case 0x7d:
      *l2 = 0x800;
      break;
    case 0x7e:
      *l2 = 0x100;
      break;
    case 0x7f:
      *l2 = 0x200;
      break;
    case 0x80:
      *l2 = 0x200;
      break;
    case 0x81:
      *l2 = 0x80;
      break;
    case 0x82:
      *l2 = 0x100;
      break;
    case 0x83:
      *l2 = 0x200;
      break;
    case 0x84:
      *l2 = 0x400;
      break;
    case 0x85:
      *l2 = 0x800;
      break;
    case 0x86:
      *l2 = 0x200;
      break;
    case 0x87:
      *l2 = 0x400;
      break;
    case 0x88:
      *l3 = 0x800;
      break;
    case 0x89:
      *l3 = 0x1000;
      break;
    case 0x8a:
      *l3 = 0x2000;
      break;
    case 0x8d:
      *l3 = 0xc00;
    }
  }
  if ((bVar1) && (*l2 == *l3)) {
    *l3 = 0;
  }
  *l1 = *l1 << 10;
  *l2 = *l2 << 10;
  *l3 = *l3 << 10;
  return;
}

Assistant:

inline void queryCacheSizes_intel_codes(int& l1, int& l2, int& l3)
{
  int abcd[4];
  abcd[0] = abcd[1] = abcd[2] = abcd[3] = 0;
  l1 = l2 = l3 = 0;
  EIGEN_CPUID(abcd,0x00000002,0);
  unsigned char * bytes = reinterpret_cast<unsigned char *>(abcd)+2;
  bool check_for_p2_core2 = false;
  for(int i=0; i<14; ++i)
  {
    switch(bytes[i])
    {
      case 0x0A: l1 = 8; break;   // 0Ah   data L1 cache, 8 KB, 2 ways, 32 byte lines
      case 0x0C: l1 = 16; break;  // 0Ch   data L1 cache, 16 KB, 4 ways, 32 byte lines
      case 0x0E: l1 = 24; break;  // 0Eh   data L1 cache, 24 KB, 6 ways, 64 byte lines
      case 0x10: l1 = 16; break;  // 10h   data L1 cache, 16 KB, 4 ways, 32 byte lines (IA-64)
      case 0x15: l1 = 16; break;  // 15h   code L1 cache, 16 KB, 4 ways, 32 byte lines (IA-64)
      case 0x2C: l1 = 32; break;  // 2Ch   data L1 cache, 32 KB, 8 ways, 64 byte lines
      case 0x30: l1 = 32; break;  // 30h   code L1 cache, 32 KB, 8 ways, 64 byte lines
      case 0x60: l1 = 16; break;  // 60h   data L1 cache, 16 KB, 8 ways, 64 byte lines, sectored
      case 0x66: l1 = 8; break;   // 66h   data L1 cache, 8 KB, 4 ways, 64 byte lines, sectored
      case 0x67: l1 = 16; break;  // 67h   data L1 cache, 16 KB, 4 ways, 64 byte lines, sectored
      case 0x68: l1 = 32; break;  // 68h   data L1 cache, 32 KB, 4 ways, 64 byte lines, sectored
      case 0x1A: l2 = 96; break;   // code and data L2 cache, 96 KB, 6 ways, 64 byte lines (IA-64)
      case 0x22: l3 = 512; break;   // code and data L3 cache, 512 KB, 4 ways (!), 64 byte lines, dual-sectored
      case 0x23: l3 = 1024; break;   // code and data L3 cache, 1024 KB, 8 ways, 64 byte lines, dual-sectored
      case 0x25: l3 = 2048; break;   // code and data L3 cache, 2048 KB, 8 ways, 64 byte lines, dual-sectored
      case 0x29: l3 = 4096; break;   // code and data L3 cache, 4096 KB, 8 ways, 64 byte lines, dual-sectored
      case 0x39: l2 = 128; break;   // code and data L2 cache, 128 KB, 4 ways, 64 byte lines, sectored
      case 0x3A: l2 = 192; break;   // code and data L2 cache, 192 KB, 6 ways, 64 byte lines, sectored
      case 0x3B: l2 = 128; break;   // code and data L2 cache, 128 KB, 2 ways, 64 byte lines, sectored
      case 0x3C: l2 = 256; break;   // code and data L2 cache, 256 KB, 4 ways, 64 byte lines, sectored
      case 0x3D: l2 = 384; break;   // code and data L2 cache, 384 KB, 6 ways, 64 byte lines, sectored
      case 0x3E: l2 = 512; break;   // code and data L2 cache, 512 KB, 4 ways, 64 byte lines, sectored
      case 0x40: l2 = 0; break;   // no integrated L2 cache (P6 core) or L3 cache (P4 core)
      case 0x41: l2 = 128; break;   // code and data L2 cache, 128 KB, 4 ways, 32 byte lines
      case 0x42: l2 = 256; break;   // code and data L2 cache, 256 KB, 4 ways, 32 byte lines
      case 0x43: l2 = 512; break;   // code and data L2 cache, 512 KB, 4 ways, 32 byte lines
      case 0x44: l2 = 1024; break;   // code and data L2 cache, 1024 KB, 4 ways, 32 byte lines
      case 0x45: l2 = 2048; break;   // code and data L2 cache, 2048 KB, 4 ways, 32 byte lines
      case 0x46: l3 = 4096; break;   // code and data L3 cache, 4096 KB, 4 ways, 64 byte lines
      case 0x47: l3 = 8192; break;   // code and data L3 cache, 8192 KB, 8 ways, 64 byte lines
      case 0x48: l2 = 3072; break;   // code and data L2 cache, 3072 KB, 12 ways, 64 byte lines
      case 0x49: if(l2!=0) l3 = 4096; else {check_for_p2_core2=true; l3 = l2 = 4096;} break;// code and data L3 cache, 4096 KB, 16 ways, 64 byte lines (P4) or L2 for core2
      case 0x4A: l3 = 6144; break;   // code and data L3 cache, 6144 KB, 12 ways, 64 byte lines
      case 0x4B: l3 = 8192; break;   // code and data L3 cache, 8192 KB, 16 ways, 64 byte lines
      case 0x4C: l3 = 12288; break;   // code and data L3 cache, 12288 KB, 12 ways, 64 byte lines
      case 0x4D: l3 = 16384; break;   // code and data L3 cache, 16384 KB, 16 ways, 64 byte lines
      case 0x4E: l2 = 6144; break;   // code and data L2 cache, 6144 KB, 24 ways, 64 byte lines
      case 0x78: l2 = 1024; break;   // code and data L2 cache, 1024 KB, 4 ways, 64 byte lines
      case 0x79: l2 = 128; break;   // code and data L2 cache, 128 KB, 8 ways, 64 byte lines, dual-sectored
      case 0x7A: l2 = 256; break;   // code and data L2 cache, 256 KB, 8 ways, 64 byte lines, dual-sectored
      case 0x7B: l2 = 512; break;   // code and data L2 cache, 512 KB, 8 ways, 64 byte lines, dual-sectored
      case 0x7C: l2 = 1024; break;   // code and data L2 cache, 1024 KB, 8 ways, 64 byte lines, dual-sectored
      case 0x7D: l2 = 2048; break;   // code and data L2 cache, 2048 KB, 8 ways, 64 byte lines
      case 0x7E: l2 = 256; break;   // code and data L2 cache, 256 KB, 8 ways, 128 byte lines, sect. (IA-64)
      case 0x7F: l2 = 512; break;   // code and data L2 cache, 512 KB, 2 ways, 64 byte lines
      case 0x80: l2 = 512; break;   // code and data L2 cache, 512 KB, 8 ways, 64 byte lines
      case 0x81: l2 = 128; break;   // code and data L2 cache, 128 KB, 8 ways, 32 byte lines
      case 0x82: l2 = 256; break;   // code and data L2 cache, 256 KB, 8 ways, 32 byte lines
      case 0x83: l2 = 512; break;   // code and data L2 cache, 512 KB, 8 ways, 32 byte lines
      case 0x84: l2 = 1024; break;   // code and data L2 cache, 1024 KB, 8 ways, 32 byte lines
      case 0x85: l2 = 2048; break;   // code and data L2 cache, 2048 KB, 8 ways, 32 byte lines
      case 0x86: l2 = 512; break;   // code and data L2 cache, 512 KB, 4 ways, 64 byte lines
      case 0x87: l2 = 1024; break;   // code and data L2 cache, 1024 KB, 8 ways, 64 byte lines
      case 0x88: l3 = 2048; break;   // code and data L3 cache, 2048 KB, 4 ways, 64 byte lines (IA-64)
      case 0x89: l3 = 4096; break;   // code and data L3 cache, 4096 KB, 4 ways, 64 byte lines (IA-64)
      case 0x8A: l3 = 8192; break;   // code and data L3 cache, 8192 KB, 4 ways, 64 byte lines (IA-64)
      case 0x8D: l3 = 3072; break;   // code and data L3 cache, 3072 KB, 12 ways, 128 byte lines (IA-64)

      default: break;
    }
  }
  if(check_for_p2_core2 && l2 == l3)
    l3 = 0;
  l1 *= 1024;
  l2 *= 1024;
  l3 *= 1024;
}